

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O1

ALLEGRO_FILE * al_fopen_fd(int fd,char *mode)

{
  undefined8 *userdata;
  ALLEGRO_FILE *f;
  FILE *pFVar1;
  int *piVar2;
  
  userdata = (undefined8 *)
             al_malloc_with_context
                       (0x60,0x4d,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
                        ,"al_fopen_fd");
  if (userdata != (undefined8 *)0x0) {
    *userdata = 0;
    *(undefined4 *)(userdata + 1) = 0;
    f = al_create_file_handle(&_al_file_interface_stdio,userdata);
    if (f == (ALLEGRO_FILE *)0x0) {
      al_free_with_context
                (userdata,0x59,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
                 ,"al_fopen_fd");
    }
    else {
      pFVar1 = fdopen(fd,mode);
      if (pFVar1 != (FILE *)0x0) {
        *userdata = pFVar1;
        return f;
      }
      piVar2 = __errno_location();
      al_set_errno(*piVar2);
      al_fclose(f);
    }
  }
  return (ALLEGRO_FILE *)0x0;
}

Assistant:

ALLEGRO_FILE *al_fopen_fd(int fd, const char *mode)
{
   ALLEGRO_FILE *f;
   USERDATA *userdata;
   FILE *fp;

   userdata = al_malloc(sizeof(USERDATA));
   if (!userdata)
      return NULL;

   /* The fd should remain open if this function fails in any way,
    * so delay the fdopen() call to last.
    */
   userdata->fp = NULL;
   userdata->errnum = 0;

   f = al_create_file_handle(&_al_file_interface_stdio, userdata);
   if (!f) {
      al_free(userdata);
      return NULL;
   }

   fp = fdopen(fd, mode);
   if (!fp) {
      al_set_errno(errno);
      al_fclose(f);
      return NULL;
   }

   userdata->fp = fp;
   return f;
}